

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_stop_in_cb(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_fs_event_t *handle;
  int64_t eval_b;
  int64_t eval_b_2;
  char path [24];
  uv_timer_t timer;
  uv_fs_event_t fs;
  undefined1 local_118 [24];
  uv_close_cb p_Stack_100;
  uv__queue *local_f8;
  uv_timer_t local_f0;
  uv_fs_event_t local_78;
  
  local_118[0x10] = 'f';
  local_118[0x11] = 's';
  local_118[0x12] = '_';
  local_118[0x13] = 'e';
  local_118[0x14] = 'v';
  local_118[0x15] = 'e';
  local_118[0x16] = 'n';
  local_118[0x17] = 't';
  p_Stack_100 = (uv_close_cb)0x6e695f706f74735f;
  local_f8 = (uv__queue *)0x7478742e62635f;
  remove(local_118 + 0x10);
  create_file(local_118 + 0x10);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_event_init(puVar2,&local_78);
  local_f0.data = (void *)(long)iVar1;
  local_118._0_8_ = (uv_loop_t *)0x0;
  if ((uv__queue *)local_f0.data == (uv__queue *)0x0) {
    iVar1 = uv_fs_event_start(&local_78,fs_event_cb_stop,(char *)(local_118 + 0x10),0);
    local_f0.data = (void *)(long)iVar1;
    local_118._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)local_f0.data != (uv__queue *)0x0) goto LAB_00186886;
    local_f0.data = (uv__queue *)(local_118 + 0x10);
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&local_f0);
    local_118._0_8_ = SEXT48(iVar1);
    local_118._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_118._0_8_ != (uv_loop_t *)0x0) goto LAB_00186893;
    iVar1 = uv_timer_start(&local_f0,timer_cb_touch,100,0);
    local_118._0_8_ = SEXT48(iVar1);
    local_118._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_118._0_8_ != (uv_loop_t *)0x0) goto LAB_001868a0;
    local_118._0_8_ = SEXT48(fs_event_cb_stop_calls);
    local_118._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_118._0_8_ != (uv_loop_t *)0x0) goto LAB_001868ad;
    local_118._0_8_ = SEXT48(timer_cb_touch_called);
    local_118._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_118._0_8_ != (uv_loop_t *)0x0) goto LAB_001868ba;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_118._0_8_ = SEXT48(iVar1);
    local_118._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_118._0_8_ != (uv_loop_t *)0x0) goto LAB_001868c7;
    local_118._0_8_ = (uv_loop_t *)0x1;
    local_118._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)local_118._8_8_ != (uv_loop_t *)0x1) goto LAB_001868d4;
    local_118._0_8_ = (uv_loop_t *)0x1;
    local_118._8_8_ = SEXT48(timer_cb_touch_called);
    if ((uv_loop_t *)local_118._8_8_ != (uv_loop_t *)0x1) goto LAB_001868e1;
    uv_close((uv_handle_t *)&local_78,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_118._0_8_ = SEXT48(iVar1);
    local_118._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_118._0_8_ != (uv_loop_t *)0x0) goto LAB_001868ee;
    local_118._0_8_ = (uv_loop_t *)0x1;
    local_118._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)local_118._8_8_ == (uv_loop_t *)0x1) {
      remove(local_118 + 0x10);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      local_118._0_8_ = (uv_loop_t *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      local_118._8_8_ = SEXT48(iVar1);
      if (local_118._0_8_ == local_118._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00186908;
    }
  }
  else {
    run_test_fs_event_stop_in_cb_cold_1();
LAB_00186886:
    run_test_fs_event_stop_in_cb_cold_2();
LAB_00186893:
    run_test_fs_event_stop_in_cb_cold_3();
LAB_001868a0:
    run_test_fs_event_stop_in_cb_cold_4();
LAB_001868ad:
    run_test_fs_event_stop_in_cb_cold_5();
LAB_001868ba:
    run_test_fs_event_stop_in_cb_cold_6();
LAB_001868c7:
    run_test_fs_event_stop_in_cb_cold_7();
LAB_001868d4:
    run_test_fs_event_stop_in_cb_cold_8();
LAB_001868e1:
    run_test_fs_event_stop_in_cb_cold_9();
LAB_001868ee:
    run_test_fs_event_stop_in_cb_cold_10();
  }
  run_test_fs_event_stop_in_cb_cold_11();
LAB_00186908:
  handle = (uv_fs_event_t *)local_118;
  run_test_fs_event_stop_in_cb_cold_12();
  uv_fs_event_stop(handle);
  fs_event_cb_stop_calls = fs_event_cb_stop_calls + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_stop_in_cb) {
  uv_fs_event_t fs;
  uv_timer_t timer;
  char path[] = "fs_event_stop_in_cb.txt";

#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  remove(path);
  create_file(path);

  ASSERT_OK(uv_fs_event_init(uv_default_loop(), &fs));
  ASSERT_OK(uv_fs_event_start(&fs, fs_event_cb_stop, path, 0));

  /* Note: timer_cb_touch() closes the handle. */
  timer.data = path;
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_cb_touch, 100, 0));

  ASSERT_OK(fs_event_cb_stop_calls);
  ASSERT_OK(timer_cb_touch_called);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, fs_event_cb_stop_calls);
  ASSERT_EQ(1, timer_cb_touch_called);

  uv_close((uv_handle_t*) &fs, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, fs_event_cb_stop_calls);

  remove(path);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}